

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O1

void __thiscall CTPNObjProp::gen_code(CTPNObjProp *this,int param_1,int param_2)

{
  undefined1 *puVar1;
  ushort uVar2;
  CTPNCodeBody *pCVar3;
  CTcPrsNode *pCVar4;
  ulong ofs;
  undefined4 uVar5;
  undefined4 uVar6;
  long lVar7;
  CTcTokenizer *pCVar8;
  CTcGenTarg *this_00;
  int iVar9;
  CTcDataStream *ds;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CTcDataStream *__n;
  char buf [5];
  vm_val_t val;
  char local_35 [5];
  vm_val_t local_30;
  
  ds = CTcSymObjBase::get_stream_from_meta
                 ((((this->super_CTPNObjPropBase).objdef_)->obj_sym_->super_CTcSymObjBase).
                  metaclass_);
  pCVar8 = G_tok;
  uVar5 = *(undefined4 *)
           ((long)&(this->super_CTPNObjPropBase).super_CTPNStm.super_CTPNStmBase.file_ + 4);
  lVar7 = (this->super_CTPNObjPropBase).super_CTPNStm.super_CTPNStmBase.linenum_;
  uVar6 = *(undefined4 *)
           ((long)&(this->super_CTPNObjPropBase).super_CTPNStm.super_CTPNStmBase.linenum_ + 4);
  *(undefined4 *)&G_tok->last_desc_ =
       *(undefined4 *)&(this->super_CTPNObjPropBase).super_CTPNStm.super_CTPNStmBase.file_;
  *(undefined4 *)((long)&pCVar8->last_desc_ + 4) = uVar5;
  *(int *)&pCVar8->last_linenum_ = (int)lVar7;
  *(undefined4 *)((long)&pCVar8->last_linenum_ + 4) = uVar6;
  pCVar3 = (this->super_CTPNObjPropBase).code_body_;
  if (pCVar3 == (CTPNCodeBody *)0x0) {
    pCVar4 = (this->super_CTPNObjPropBase).expr_;
    if (pCVar4 == (CTcPrsNode *)0x0) {
      return;
    }
    iVar9 = (*(pCVar4->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])();
    this_00 = G_cg;
    if (CONCAT44(extraout_var,iVar9) != 0) {
      ofs = ds->ofs_;
      iVar9 = (*(((this->super_CTPNObjPropBase).expr_)->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase
                [1])();
      CTcGenTarg::write_const_as_dh(this_00,ds,ofs,(CTcConstVal *)CONCAT44(extraout_var_00,iVar9));
      return;
    }
    iVar9 = (*(((this->super_CTPNObjPropBase).expr_)->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[7])
                      ();
    if (iVar9 == 0) {
      CTcTokenizer::throw_internal_error(0x3aa6);
    }
    pCVar4 = (this->super_CTPNObjPropBase).expr_;
    __n = ds;
    CTcGenTarg::add_const_str
              (G_cg,(char *)pCVar4[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase,
               (size_t)pCVar4[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase,ds,ds->ofs_ + 1);
    local_30.typ = VM_DSTRING;
    local_30.val.obj = 0;
  }
  else {
    uVar2 = (((this->super_CTPNObjPropBase).prop_sym_)->super_CTcSymPropBase).prop_;
    __n = (CTcDataStream *)(ulong)uVar2;
    if (G_prs->constructor_prop_ == (uint)uVar2) {
      puVar1 = &pCVar3->field_0xd4;
      *puVar1 = *puVar1 | 1;
    }
    if (((this->super_CTPNObjPropBase).field_0x58 & 1) != 0) {
      puVar1 = &((this->super_CTPNObjPropBase).code_body_)->field_0xd4;
      *puVar1 = *puVar1 | 4;
      CTcDataStream::write_obj_id
                (G_static_init_id_stream,
                 (((this->super_CTPNObjPropBase).objdef_)->obj_sym_->super_CTcSymObjBase).obj_id_);
      CTcDataStream::write_prop_id
                (G_static_init_id_stream,
                 (uint)(((this->super_CTPNObjPropBase).prop_sym_)->super_CTcSymPropBase).prop_);
    }
    pCVar3 = (this->super_CTPNObjPropBase).code_body_;
    (**(pCVar3->super_CTPNCodeBodyBase).super_CTPNStmTop.super_CTPNStm.super_CTPNStmBase.
       super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase)(pCVar3,0,0);
    local_30.typ = VM_CODEOFS;
    local_30.val.obj = 0;
    CTcAbsFixup::add_abs_fixup
              ((((this->super_CTPNObjPropBase).code_body_)->super_CTPNCodeBodyBase).
               fixup_list_anchor_,ds,ds->ofs_ + 1);
  }
  vmb_put_dh(local_35,&local_30);
  CTcDataStream::write(ds,(int)local_35,(void *)0x5,(size_t)__n);
  return;
}

Assistant:

void CTPNObjProp::gen_code(int, int)
{
    vm_val_t val;
    char buf[VMB_DATAHOLDER];

    /* get the correct data stream */
    CTcDataStream *str = objdef_->get_obj_sym()->get_stream();

    /* set the current source location for error reporting */
    G_tok->set_line_info(file_, linenum_);

    /* generate code for our expression or our code body, as appropriate */
    if (code_body_ != 0)
    {
        /* if this is a constructor, mark the code body accordingly */
        if (prop_sym_->get_prop() == G_prs->get_constructor_prop())
            code_body_->set_constructor(TRUE);

        /* if it's static, do some extra work */
        if (is_static_)
        {
            /* mark the code body as static */
            code_body_->set_static();

            /* 
             *   add the obj.prop to the static ID stream, so the VM knows to
             *   invoke this initializer at start-up 
             */
            G_static_init_id_stream
                ->write_obj_id(objdef_->get_obj_sym()->get_obj_id());
            G_static_init_id_stream
                ->write_prop_id(prop_sym_->get_prop());
        }

        /* tell our code body to generate the code */
        code_body_->gen_code(FALSE, FALSE);

        /* 
         *   Set up our code offset value.  Write a code offset of zero for
         *   now, since we won't know the correct offset until link time.  
         */
        val.set_codeofs(0);

        /* 
         *   Add a fixup to the code body's fixup list for our dataholder, so
         *   that we fix up the property value when we link.  Note that the
         *   fixup is one byte into our object stream from the current
         *   offset, because the first byte is the type.  
         */
        CTcAbsFixup::add_abs_fixup(code_body_->get_fixup_list_head(),
                                   str, str->get_ofs() + 1);
        
        /* write out our value in DATAHOLDER format */
        vmb_put_dh(buf, &val);
        str->write(buf, VMB_DATAHOLDER);
    }
    else if (expr_ != 0)
    {
        /* 
         *   if my value is constant, write out a dataholder for the constant
         *   value to the stream; otherwise, write out our code and store a
         *   pointer to the code 
         */
        if (expr_->is_const())
        {
            /* write the constant value to the object stream */
            G_cg->write_const_as_dh(str, str->get_ofs(),
                                    expr_->get_const_val());
        }
        else if (expr_->is_dstring())
        {
            /* it's a double-quoted string node */
            CTPNDstr *dstr = (CTPNDstr *)expr_;

            /* 
             *   Add the string to the constant pool.  Note that the fixup
             *   will be one byte from the current object stream offset,
             *   since we need to write the type byte first.  
             */
            G_cg->add_const_str(dstr->get_str(), dstr->get_str_len(),
                                str, str->get_ofs() + 1);

            /* 
             *   Set up the dstring value.  Use a zero placeholder for now;
             *   add_const_str() already added a fixup for us that will
             *   supply the correct value at link time.  
             */
            val.set_dstring(0);
            vmb_put_dh(buf, &val);
            str->write(buf, VMB_DATAHOLDER);
        }
        else
        {
            /* we should never get here */
            G_tok->throw_internal_error(TCERR_INVAL_PROP_CODE_GEN);
        }
    }
}